

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int RunVar(undefined8 param_1,short param_2,undefined8 param_3,Commandline *param_4)

{
  size_type __n;
  short sVar1;
  int iVar2;
  uint uVar3;
  char *value;
  const_iterator cVar4;
  ostream *poVar5;
  ulong uVar6;
  long lVar7;
  initializer_list<bhf::ParameterOption> list;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  __l;
  allocator_type local_346;
  less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_345;
  uint32_t bytesRead;
  vector<unsigned_char,_std::allocator<unsigned_char>_> readBuffer;
  int local_328 [8];
  AdsHandle handle;
  AdsDevice device;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  stringstream stream;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_220;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_1f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_1d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_1a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_180 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string local_80;
  ParameterList params;
  
  std::__cxx11::string::string((string *)&local_80,"--type",(allocator *)&device);
  std::__cxx11::string::string((string *)&local_a0,"",(allocator *)&handle);
  bhf::ParameterOption::ParameterOption((ParameterOption *)&stream,&local_80,false,&local_a0);
  list._M_len = 1;
  list._M_array = (iterator)&stream;
  bhf::ParameterList::ParameterList(&params,list);
  bhf::ParameterOption::~ParameterOption((ParameterOption *)&stream);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  bhf::Commandline::Parse((ParameterList *)param_4);
  std::__cxx11::string::string((string *)&stream,"Variable name is missing",(allocator *)&device);
  bhf::Commandline::Pop<std::__cxx11::string>(&name,param_4,(string *)&stream);
  std::__cxx11::string::~string((string *)&stream);
  _stream = (pointer)&local_238;
  local_238._M_local_buf[0] = '\0';
  value = bhf::Commandline::Pop<char_const*>((string *)param_4);
  std::__cxx11::string::~string((string *)&stream);
  if ((RunVar(AmsNetId,unsigned_short,std::__cxx11::string_const&,bhf::Commandline&)::
       typeMap_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&RunVar(AmsNetId,unsigned_short,std::__cxx11::string_const&,bhf::Commandline&)
                                   ::typeMap_abi_cxx11_), iVar2 != 0)) {
    _device = 1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::pair<const_char_(&)[5],_int,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                *)&stream,(char (*) [5])"BOOL",(int *)&device);
    handle._M_t.super___uniq_ptr_impl<unsigned_int,_ResourceDeleter<unsigned_int>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_int_*,_ResourceDeleter<unsigned_int>_>.
    super__Tuple_impl<1UL,_ResourceDeleter<unsigned_int>_>.
    super__Head_base<1UL,_ResourceDeleter<unsigned_int>,_false>._M_head_impl =
         (ResourceDeleter<unsigned_int>)0x1;
    handle._M_t.super___uniq_ptr_impl<unsigned_int,_ResourceDeleter<unsigned_int>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_int_*,_ResourceDeleter<unsigned_int>_>.
    super__Tuple_impl<1UL,_ResourceDeleter<unsigned_int>_>.
    super__Head_base<1UL,_ResourceDeleter<unsigned_int>,_false>._1_3_ = 0;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::pair<const_char_(&)[5],_int,_true>(&local_220,(char (*) [5])"BYTE",(int *)&handle);
    type._M_dataplus._M_p._0_4_ = 2;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::pair<const_char_(&)[5],_int,_true>(&local_1f8,(char (*) [5])0x10e593,(int *)&type);
    local_328[0] = 4;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::pair<const_char_(&)[6],_int,_true>(&local_1d0,(char (*) [6])"DWORD",local_328);
    readBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 8;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::pair<const_char_(&)[6],_int,_true>(&local_1a8,(char (*) [6])"LWORD",(int *)&readBuffer);
    bytesRead = 0xff;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::pair<const_char_(&)[7],_int,_true>(local_180,(char (*) [7])"STRING",(int *)&bytesRead);
    __l._M_len = 6;
    __l._M_array = (iterator)&stream;
    std::
    map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::map(&RunVar(AmsNetId,unsigned_short,std::__cxx11::string_const&,bhf::Commandline&)::
           typeMap_abi_cxx11_,__l,&local_345,&local_346);
    lVar7 = 200;
    do {
      std::__cxx11::string::~string((string *)(&stream + lVar7));
      lVar7 = lVar7 + -0x28;
    } while (lVar7 != -0x28);
    __cxa_atexit(std::
                 map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::~map,&RunVar(AmsNetId,unsigned_short,std::__cxx11::string_const&,bhf::Commandline&)
                         ::typeMap_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&RunVar(AmsNetId,unsigned_short,std::__cxx11::string_const&,bhf::Commandline&)
                         ::typeMap_abi_cxx11_);
  }
  std::__cxx11::string::string((string *)&stream,"--type",(allocator *)&device);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  bhf::ParameterList::Get<std::__cxx11::string>(&type,&params,(string *)&stream,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&stream);
  cVar4 = std::
          _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::find(&RunVar(AmsNetId,unsigned_short,std::__cxx11::string_const&,bhf::Commandline&)::
                  typeMap_abi_cxx11_._M_t,&type);
  if ((_Rb_tree_header *)cVar4._M_node ==
      &RunVar(AmsNetId,unsigned_short,std::__cxx11::string_const&,bhf::Commandline&)::
       typeMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    poVar5 = std::operator<<((ostream *)local_238._M_local_buf,"RunVar");
    poVar5 = std::operator<<(poVar5,"(): Unknown TwinCAT type \'");
    poVar5 = std::operator<<(poVar5,(string *)&type);
    std::operator<<(poVar5,"\'\n");
    std::__cxx11::stringbuf::str();
    Logger::Log(3,(string *)&device);
    std::__cxx11::string::~string((string *)&device);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    iVar2 = -1;
    goto LAB_00108e43;
  }
  __n = *(size_type *)(cVar4._M_node + 2);
  sVar1 = 0x353;
  if (param_2 != 0) {
    sVar1 = param_2;
  }
  AdsDevice::AdsDevice(&device,param_3,param_1,sVar1);
  AdsDevice::GetHandle((string *)&handle);
  if (value == (char *)0x0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&readBuffer,__n,(allocator_type *)&stream);
    bytesRead = 0;
    uVar6 = AdsDevice::ReadReqEx2
                      ((uint)&device,0xf005,
                       (ulong)*handle._M_t.
                               super___uniq_ptr_impl<unsigned_int,_ResourceDeleter<unsigned_int>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_unsigned_int_*,_ResourceDeleter<unsigned_int>_>
                               .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl,
                       readBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish +
                       -(long)CONCAT44(readBuffer.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       readBuffer.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_),
                       (uint *)CONCAT44(readBuffer.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                        readBuffer.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start._0_4_));
    if (uVar6 == 0) {
      switch(bytesRead) {
      case 1:
        uVar3 = PrintAs<unsigned_char>(&readBuffer);
        break;
      case 2:
        uVar3 = PrintAs<unsigned_short>(&readBuffer);
        break;
      default:
        std::ostream::write((char *)&std::cout,
                            CONCAT44(readBuffer.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     readBuffer.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_));
        uVar6 = (ulong)(*(int *)(AdsDevice::ReadReqEx2 + *(long *)(std::cout + -0x18)) != 0);
        goto LAB_00108e25;
      case 4:
        uVar3 = PrintAs<unsigned_int>(&readBuffer);
        break;
      case 8:
        uVar3 = PrintAs<unsigned_long>(&readBuffer);
      }
      uVar6 = (ulong)uVar3;
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)&stream);
      poVar5 = std::operator<<((ostream *)local_238._M_local_buf,"RunVar");
      poVar5 = std::operator<<(poVar5,"(): failed with: 0x");
      *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar5 = std::ostream::_M_insert<long>((long)poVar5);
      std::operator<<(poVar5,'\n');
      std::__cxx11::stringbuf::str();
      Logger::Log(3,(string *)local_328);
      std::__cxx11::string::~string((string *)local_328);
      std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    }
LAB_00108e25:
    iVar2 = (int)uVar6;
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&readBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    poVar5 = std::operator<<((ostream *)local_238._M_local_buf,"name>");
    poVar5 = std::operator<<(poVar5,(string *)&name);
    poVar5 = std::operator<<(poVar5,"< value>");
    poVar5 = std::operator<<(poVar5,value);
    std::operator<<(poVar5,"<\n");
    std::__cxx11::stringbuf::str();
    Logger::Log(0,(string *)local_328);
    std::__cxx11::string::~string((string *)local_328);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    poVar5 = std::operator<<((ostream *)local_238._M_local_buf,"size>");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5,"< value>");
    poVar5 = std::operator<<(poVar5,value);
    std::operator<<(poVar5,"<\n");
    std::__cxx11::stringbuf::str();
    Logger::Log(0,(string *)local_328);
    std::__cxx11::string::~string((string *)local_328);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    switch(__n) {
    case 1:
      iVar2 = Write<unsigned_char>(&device,&handle,value);
      break;
    case 2:
      iVar2 = Write<unsigned_short>(&device,&handle,value);
      break;
    default:
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&stream,__n,(allocator_type *)local_328);
      strncpy(_stream,value,-(long)_stream);
      iVar2 = AdsDevice::WriteReqEx
                        ((uint)&device,0xf005,
                         (ulong)*handle._M_t.
                                 super___uniq_ptr_impl<unsigned_int,_ResourceDeleter<unsigned_int>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_unsigned_int_*,_ResourceDeleter<unsigned_int>_>
                                 .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl,
                         (void *)-(long)_stream);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)&stream);
      break;
    case 4:
      iVar2 = Write<unsigned_int>(&device,&handle,value);
      break;
    case 8:
      iVar2 = Write<unsigned_long>(&device,&handle,value);
    }
  }
  std::unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_>::~unique_ptr(&handle);
  AdsDevice::~AdsDevice(&device);
LAB_00108e43:
  std::__cxx11::string::~string((string *)&type);
  std::__cxx11::string::~string((string *)&name);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption>_>_>
               *)&params);
  return iVar2;
}

Assistant:

int RunVar(const AmsNetId netid, const uint16_t port, const std::string& gw, bhf::Commandline& args)
{
    bhf::ParameterList params = {
        {"--type"},
    };
    args.Parse(params);

    const auto name = args.Pop<std::string>("Variable name is missing");
    const auto value = args.Pop<const char*>();
    static const std::map<const std::string, size_t> typeMap = {
        {"BOOL", 1},
        {"BYTE", 1},
        {"WORD", 2},
        {"DWORD", 4},
        {"LWORD", 8},
        {"STRING", 255},
    };
    const auto type = params.Get<std::string>("--type");
    const auto it = typeMap.find(type);
    if (typeMap.end() == it) {
        LOG_ERROR(__FUNCTION__ << "(): Unknown TwinCAT type '" << type << "'\n");
        return -1;
    }
    const auto size = it->second;

    auto device = AdsDevice { gw, netid, port ? port : uint16_t(AMSPORT_R0_PLC_TC3) };
    const auto handle = device.GetHandle(name);

    if (!value) {
        std::vector<uint8_t> readBuffer(size);
        uint32_t bytesRead = 0;
        const auto status = device.ReadReqEx2(ADSIGRP_SYM_VALBYHND,
                                              *handle,
                                              readBuffer.size(),
                                              readBuffer.data(),
                                              &bytesRead);
        if (ADSERR_NOERR != status) {
            LOG_ERROR(__FUNCTION__ << "(): failed with: 0x" << std::hex << status << '\n');
            return status;
        }

        switch (bytesRead) {
        case sizeof(uint8_t):
            return PrintAs<uint8_t>(readBuffer);

        case sizeof(uint16_t):
            return PrintAs<uint16_t>(readBuffer);

        case sizeof(uint32_t):
            return PrintAs<uint32_t>(readBuffer);

        case sizeof(uint64_t):
            return PrintAs<uint64_t>(readBuffer);

        default:
            bhf::ForceBinaryOutputOnWindows();
            std::cout.write((const char*)readBuffer.data(), bytesRead);
            return !std::cout.good();
        }
    }

    LOG_VERBOSE("name>" << name << "< value>" << value << "<\n");
    LOG_VERBOSE("size>" << size << "< value>" << value << "<\n");

    switch (size) {
    case sizeof(uint8_t):
        return Write<uint8_t>(device, handle, value);

    case sizeof(uint16_t):
        return Write<uint16_t>(device, handle, value);

    case sizeof(uint32_t):
        return Write<uint32_t>(device, handle, value);

    case sizeof(uint64_t):
        return Write<uint64_t>(device, handle, value);

    default:
        {
            auto writeBuffer = std::vector<char>(size);
            strncpy(writeBuffer.data(), value, writeBuffer.size());
            return device.WriteReqEx(ADSIGRP_SYM_VALBYHND,
                                     *handle,
                                     writeBuffer.size(),
                                     writeBuffer.data());
        }
    }
}